

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesize.cpp
# Opt level: O0

void __thiscall
QPageSizePrivate::QPageSizePrivate
          (QPageSizePrivate *this,QString *key,QSize *pointSize,QString *name)

{
  bool bVar1;
  QSize *in_RCX;
  EVP_PKEY_CTX *in_RDX;
  QSize *in_RSI;
  QPageSizePrivate *in_RDI;
  QSize *unaff_retaddr;
  SizeMatchPolicy in_stack_0000000c;
  QSize *in_stack_00000010;
  PageSizeId id;
  PageSizeId local_24;
  QPageSizePrivate *ppdKey;
  
  ppdKey = in_RDI;
  QSharedData::QSharedData((QSharedData *)0x550b5b);
  QString::QString((QString *)0x550b69);
  in_RDI->m_id = Custom;
  QSize::QSize((QSize *)in_RDI);
  QString::QString((QString *)0x550b8c);
  in_RDI->m_windowsId = 0;
  QSizeF::QSizeF(&in_RDI->m_size);
  in_RDI->m_units = Point;
  bVar1 = QString::isEmpty((QString *)0x550bb7);
  if ((!bVar1) && (bVar1 = QSize::isValid(in_RCX), bVar1)) {
    local_24 = qt_idForPpdKey((QString *)ppdKey,in_RSI);
    if (local_24 == Custom) {
      local_24 = qt_idForPointSize(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    }
    if (local_24 == Custom) {
      init(in_RDI,in_RDX);
    }
    else {
      init(in_RDI,(EVP_PKEY_CTX *)(ulong)local_24);
    }
    QString::operator=(&in_RDI->m_key,(QString *)in_RSI);
  }
  return;
}

Assistant:

QPageSizePrivate::QPageSizePrivate(const QString &key, const QSize &pointSize, const QString &name)
    : m_id(QPageSize::Custom),
      m_windowsId(0),
      m_units(QPageSize::Point)
{
    if (!key.isEmpty() && pointSize.isValid()) {
        QPageSize::PageSizeId id = qt_idForPpdKey(key, nullptr);
        // If not a known PPD key, check if size is a standard PPD size
        if (id == QPageSize::Custom)
            id = qt_idForPointSize(pointSize, QPageSize::FuzzyMatch, nullptr);
        id == QPageSize::Custom ? init(pointSize, name) : init(id, name);
        m_key = key;
    }
}